

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::api::anon_unknown_0::BuffersTestCase::createInstance(BuffersTestCase *this,Context *ctx)

{
  ostringstream *this_00;
  VkSharingMode VVar1;
  TestInstance *pTVar2;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar3;
  NotSupportedError *this_01;
  _func_int **pp_Var4;
  pointer pVVar5;
  long lVar6;
  float queuePriority;
  VkPhysicalDeviceFeatures deviceFeatures;
  Move<vk::VkDevice_s_*> local_248;
  undefined4 local_22c;
  pointer local_228;
  pointer pVStack_220;
  pointer local_218;
  undefined8 uStack_210;
  undefined4 *local_208;
  undefined1 local_1f8 [16];
  pointer local_1e8;
  VkDeviceQueueCreateInfo *pVStack_1e0;
  undefined8 local_1d8;
  char **ppcStack_1d0;
  undefined8 local_1c8;
  char **ppcStack_1c0;
  VkPhysicalDeviceFeatures *local_1b8;
  undefined1 local_1b0 [384];
  
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  ::vk::getBufferUsageFlagsStr((Bitfield<32UL> *)&local_228,(this->m_testCase).usage);
  local_1e8 = local_218;
  local_1f8._0_8_ = local_228;
  local_1f8._8_8_ = pVStack_220;
  tcu::Format::Bitfield<32UL>::toStream((Bitfield<32UL> *)local_1f8,(ostream *)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  pTVar2 = (TestInstance *)operator_new(0x30);
  pp_Var4 = *(_func_int ***)&this->m_testCase;
  VVar1 = (this->m_testCase).sharingMode;
  pTVar2->m_context = ctx;
  pTVar2->_vptr_TestInstance = (_func_int **)&PTR__BufferTestInstance_00cef6d0;
  pTVar2[1]._vptr_TestInstance = pp_Var4;
  *(VkSharingMode *)&pTVar2[1].m_context = VVar1;
  if (((ulong)pp_Var4 & 0x700000000) == 0) {
    pp_Var4 = (_func_int **)0x0;
LAB_0040cc84:
    pTVar2[2]._vptr_TestInstance = pp_Var4;
    return pTVar2;
  }
  vk = Context::getInstanceInterface(ctx);
  physicalDevice = Context::getPhysicalDevice(ctx);
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)local_1b0,vk,physicalDevice);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_1f8,vk,physicalDevice);
  if (local_1f8._8_8_ - local_1f8._0_8_ != 0) {
    lVar3 = ((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 3) * -0x5555555555555555;
    lVar6 = 0;
    pVVar5 = (pointer)local_1f8._0_8_;
    do {
      if ((~pVVar5->queueFlags & 9) == 0) {
        operator_delete((void *)local_1f8._0_8_,(long)local_1e8 - local_1f8._0_8_);
        local_208 = &local_22c;
        local_22c = 0x3f800000;
        pVStack_220 = (pointer)0x0;
        local_1f8._8_8_ = (pointer)0x0;
        local_1d8._0_4_ = 0;
        local_1d8._4_4_ = 0;
        ppcStack_1d0 = (char **)0x0;
        local_1c8._0_4_ = 0;
        local_1c8._4_4_ = 0;
        ppcStack_1c0 = (char **)0x0;
        local_228 = (pointer)0x2;
        local_218 = (pointer)(lVar6 << 0x20);
        uStack_210 = 1;
        local_1f8._0_8_ = (pointer)0x3;
        local_1e8 = (pointer)0x100000000;
        local_1b8 = (VkPhysicalDeviceFeatures *)local_1b0;
        pVStack_1e0 = (VkDeviceQueueCreateInfo *)&local_228;
        ::vk::createDevice(&local_248,vk,physicalDevice,(VkDeviceCreateInfo *)local_1f8,
                           (VkAllocationCallbacks *)0x0);
        pp_Var4 = (_func_int **)operator_new(0x4d8);
        pp_Var4[2] = (_func_int *)
                     local_248.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
        *pp_Var4 = (_func_int *)local_248.super_RefBase<vk::VkDevice_s_*>.m_data.object;
        pp_Var4[1] = (_func_int *)
                     local_248.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
        local_248.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice)0x0;
        local_248.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
             (DestroyDeviceFunc)0x0;
        local_248.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        *(int *)(pp_Var4 + 3) = (int)lVar6;
        ::vk::DeviceDriver::DeviceDriver((DeviceDriver *)(pp_Var4 + 4),vk,(VkDevice)*pp_Var4);
        if (local_248.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
          (*local_248.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                    (local_248.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     local_248.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
        }
        goto LAB_0040cc84;
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar6);
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"No matching queue found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
             ,0x82);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual TestInstance*	createInstance		(Context&				ctx) const
							{
								tcu::TestLog& log	= m_testCtx.getLog();
								log << tcu::TestLog::Message << getBufferUsageFlagsStr(m_testCase.usage) << tcu::TestLog::EndMessage;
								return new BufferTestInstance(ctx, m_testCase);
							}